

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Loop::ComputeLoopStructuredOrder
          (Loop *this,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *ordered_loop_blocks,bool include_pre_header,bool include_merge)

{
  CFG *pCVar1;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *this_00;
  bool bVar2;
  BasicBlockListTy *this_01;
  size_type sVar3;
  BasicBlock *pBVar4;
  FeatureManager *this_02;
  Function *func;
  reference ppBVar5;
  BasicBlock *pBVar6;
  BasicBlock *local_98;
  BasicBlock *bb;
  iterator __end3;
  iterator __begin3;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range3;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  function<void_(spvtools::opt::BasicBlock_*)> local_50;
  undefined1 local_29;
  CFG *pCStack_28;
  bool is_shader;
  CFG *cfg;
  bool include_merge_local;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *pvStack_18;
  bool include_pre_header_local;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *ordered_loop_blocks_local;
  Loop *this_local;
  
  cfg._6_1_ = include_merge;
  cfg._7_1_ = include_pre_header;
  pvStack_18 = ordered_loop_blocks;
  ordered_loop_blocks_local =
       (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)this;
  pCStack_28 = IRContext::cfg(this->context_);
  this_00 = pvStack_18;
  this_01 = GetBlocks(this);
  sVar3 = std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::size(this_01);
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::reserve
            (this_00,sVar3 + (cfg._7_1_ & 1) + (ulong)(cfg._6_1_ & 1));
  if (((cfg._7_1_ & 1) != 0) && (pBVar4 = GetPreHeaderBlock(this), pBVar4 != (BasicBlock *)0x0)) {
    std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
    push_back(pvStack_18,&this->loop_preheader_);
  }
  this_02 = IRContext::get_feature_mgr(this->context_);
  local_29 = FeatureManager::HasCapability(this_02,Shader);
  pCVar1 = pCStack_28;
  if ((bool)local_29) {
    std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
    list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
         &__range3);
    pCVar1 = pCStack_28;
    func = BasicBlock::GetParent(this->loop_header_);
    CFG::ComputeStructuredOrder
              (pCVar1,func,this->loop_header_,this->loop_merge_,
               (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
               &__range3);
    __end3 = std::__cxx11::
             list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::begin
                       ((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                         *)&__range3);
    bb = (BasicBlock *)
         std::__cxx11::
         list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::end
                   ((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     *)&__range3);
    while (bVar2 = std::operator!=(&__end3,(_Self *)&bb), bVar2) {
      ppBVar5 = std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&__end3);
      pBVar4 = *ppBVar5;
      local_98 = pBVar4;
      pBVar6 = GetMergeBlock(this);
      if (pBVar4 == pBVar6) break;
      std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      push_back(pvStack_18,&local_98);
      std::_List_iterator<spvtools::opt::BasicBlock_*>::operator++(&__end3);
    }
    std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
    ~list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
          &__range3);
  }
  else {
    pBVar4 = this->loop_header_;
    order.
    super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl._M_node._M_size = (size_t)pvStack_18;
    std::function<void(spvtools::opt::BasicBlock*)>::
    function<spvtools::opt::Loop::ComputeLoopStructuredOrder(std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>*,bool,bool)const::__0,void>
              ((function<void(spvtools::opt::BasicBlock*)> *)&local_50,
               (anon_class_16_2_d7b58a46 *)
               &order.
                super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ._M_impl._M_node._M_size);
    CFG::ForEachBlockInReversePostOrder(pCVar1,pBVar4,&local_50);
    std::function<void_(spvtools::opt::BasicBlock_*)>::~function(&local_50);
  }
  if (((cfg._6_1_ & 1) != 0) && (pBVar4 = GetMergeBlock(this), pBVar4 != (BasicBlock *)0x0)) {
    std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
    push_back(pvStack_18,&this->loop_merge_);
  }
  return;
}

Assistant:

void Loop::ComputeLoopStructuredOrder(
    std::vector<BasicBlock*>* ordered_loop_blocks, bool include_pre_header,
    bool include_merge) const {
  CFG& cfg = *context_->cfg();

  // Reserve the memory: all blocks in the loop + extra if needed.
  ordered_loop_blocks->reserve(GetBlocks().size() + include_pre_header +
                               include_merge);

  if (include_pre_header && GetPreHeaderBlock())
    ordered_loop_blocks->push_back(loop_preheader_);

  bool is_shader =
      context_->get_feature_mgr()->HasCapability(spv::Capability::Shader);
  if (!is_shader) {
    cfg.ForEachBlockInReversePostOrder(
        loop_header_, [ordered_loop_blocks, this](BasicBlock* bb) {
          if (IsInsideLoop(bb)) ordered_loop_blocks->push_back(bb);
        });
  } else {
    // If this is a shader, it is possible that there are unreachable merge and
    // continue blocks that must be copied to retain the structured order.
    // The structured order will include these.
    std::list<BasicBlock*> order;
    cfg.ComputeStructuredOrder(loop_header_->GetParent(), loop_header_,
                               loop_merge_, &order);
    for (BasicBlock* bb : order) {
      if (bb == GetMergeBlock()) {
        break;
      }
      ordered_loop_blocks->push_back(bb);
    }
  }
  if (include_merge && GetMergeBlock())
    ordered_loop_blocks->push_back(loop_merge_);
}